

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_parser_test.cpp
# Opt level: O3

void __thiscall bioparser::test::BioparserPafTest::Check(BioparserPafTest *this)

{
  PafOverlap *pPVar1;
  pointer puVar2;
  undefined8 *puVar3;
  long lVar4;
  pointer puVar5;
  char *pcVar6;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  undefined8 *local_18;
  
  local_28.data_._0_4_ = 500;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(this->o).
              super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->o).
              super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_20,"500","o.size()",(int *)&local_28,(unsigned_long *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/paf_parser_test.cpp"
               ,0x3a,pcVar6);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  puVar3 = local_18;
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(puVar3);
  }
  local_30._M_head_impl._0_4_ = 0x178de;
  lVar4 = 0;
  for (puVar5 = (this->o).
                super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar5 != (this->o).
                super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
    pPVar1 = (puVar5->_M_t).
             super___uniq_ptr_impl<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>
             ._M_t.
             super__Tuple_impl<0UL,_bioparser::test::PafOverlap_*,_std::default_delete<bioparser::test::PafOverlap>_>
             .super__Head_base<0UL,_bioparser::test::PafOverlap_*,_false>._M_head_impl;
    lVar4 = lVar4 + (pPVar1->q_name)._M_string_length + (pPVar1->t_name)._M_string_length;
  }
  local_28.data_._0_4_ = (int)lVar4;
  testing::internal::CmpHelperEQ<int,int>
            (local_20,"96478",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) { return s + it->q_name.size() + it->t_name.size(); })"
             ,(int *)&local_30,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/paf_parser_test.cpp"
               ,0x3e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  puVar3 = local_18;
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(puVar3);
  }
  local_30._M_head_impl._0_4_ = 0x119de3a;
  puVar5 = (this->o).
           super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->o).
           super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 == puVar2) {
    local_28.data_._0_4_ = 0;
  }
  else {
    local_28.data_._0_4_ = 0;
    do {
      pPVar1 = (puVar5->_M_t).
               super___uniq_ptr_impl<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>
               ._M_t.
               super__Tuple_impl<0UL,_bioparser::test::PafOverlap_*,_std::default_delete<bioparser::test::PafOverlap>_>
               .super__Head_base<0UL,_bioparser::test::PafOverlap_*,_false>._M_head_impl;
      local_28.data_._0_4_ =
           (uint)(pPVar1->super_Overlap).strand +
           (int)local_28.data_ + (pPVar1->super_Overlap).lhs_id + (pPVar1->super_Overlap).lhs_begin
           + (pPVar1->super_Overlap).lhs_end + pPVar1->q_len + (pPVar1->super_Overlap).rhs_id +
           (pPVar1->super_Overlap).rhs_begin + (pPVar1->super_Overlap).rhs_end + pPVar1->t_len +
           (pPVar1->super_Overlap).score + pPVar1->overlap_len + pPVar1->quality;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
  }
  testing::internal::CmpHelperEQ<int,int>
            (local_20,"18472506",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) { return s + it->lhs_id + it->lhs_begin + it->lhs_end + it->q_len + it->rhs_id + it->rhs_begin + it->rhs_end + it->t_len + it->score + it->strand + it->overlap_len + it->quality; })"
             ,(int *)&local_30,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/paf_parser_test.cpp"
               ,0x48,pcVar6);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(local_18);
  }
  return;
}

Assistant:

void Check() {
    EXPECT_EQ(500, o.size());
    EXPECT_EQ(96478, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) {
          return s + it->q_name.size() + it->t_name.size();
        }));
    EXPECT_EQ(18472506, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<PafOverlap>& it) {
          return s +
              it->lhs_id + it->lhs_begin + it->lhs_end + it->q_len +
              it->rhs_id + it->rhs_begin + it->rhs_end + it->t_len +
              it->score +
              it->strand +
              it->overlap_len +
              it->quality;
        }));
  }